

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void genlink(global_State *g,GCObject *o)

{
  GCObject **pnext;
  GCObject *o_local;
  global_State *g_local;
  
  if ((o->marked & 7) == 5) {
    pnext = getgclist(o);
    linkgclist_(o,pnext,&g->grayagain);
  }
  else if ((o->marked & 7) == 6) {
    o->marked = o->marked ^ 2;
  }
  return;
}

Assistant:

static void genlink (global_State *g, GCObject *o) {
  lua_assert(isblack(o));
  if (getage(o) == G_TOUCHED1) {  /* touched in this cycle? */
    linkobjgclist(o, g->grayagain);  /* link it back in 'grayagain' */
  }  /* everything else do not need to be linked back */
  else if (getage(o) == G_TOUCHED2)
    changeage(o, G_TOUCHED2, G_OLD);  /* advance age */
}